

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
run_default_dispatcher_and_go_further
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,env_init_t *init_fn)

{
  env_init_t *this_00;
  anon_class_8_1_8991fb9c local_78;
  anon_class_8_1_8991fb9c local_70;
  string local_68;
  anon_class_40_2_424c5504 local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"run_default_dispatcher","");
  this_00 = &local_48.init_fn;
  local_78.this = this;
  local_70.this = this;
  local_48.this = this;
  std::function<void_()>::function(this_00,init_fn);
  so_5::impl::
  run_stage<so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_1_,so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_2_,so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_3_>
            (&local_68,&local_70,&local_78,&local_48);
  if (local_48.init_fn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.init_fn.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::run_default_dispatcher_and_go_further(
	env_init_t init_fn )
	{
		::so_5::impl::run_stage(
				"run_default_dispatcher",
				[this] {
					m_default_disp.set_data_sources_name_base( "DEFAULT" );
					m_default_disp.start( m_env );
				},
				[this] {
					m_default_disp.shutdown();
					m_default_disp.wait();
				},
				[this, init_fn] {
					run_user_supplied_init_and_do_main_loop( std::move(init_fn) );
				} );
	}